

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O3

void __thiscall RootIndexProxyModel::fetchMore(RootIndexProxyModel *this,QModelIndex *parent)

{
  long lVar1;
  long *plVar2;
  QModelIndex local_28;
  
  lVar1 = QAbstractProxyModel::sourceModel();
  if (lVar1 != 0) {
    local_28.r = -1;
    local_28.c = -1;
    local_28.i = 0;
    local_28.m = (QAbstractItemModel *)0x0;
    if (((parent->r < 0) || (parent->c < 0)) || (parent->m == (QAbstractItemModel *)0x0)) {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_28,&this->m_dptr->m_rootIndex);
    }
    else {
      (**(code **)(*(long *)this + 400))(&local_28,this,parent);
    }
    plVar2 = (long *)QAbstractProxyModel::sourceModel();
    (**(code **)(*plVar2 + 0x128))(plVar2,&local_28);
  }
  return;
}

Assistant:

void RootIndexProxyModel::fetchMore(const QModelIndex &parent)
{
    Q_ASSERT(!parent.isValid() || parent.model() == this);
    if (!sourceModel())
        return;
    Q_D(RootIndexProxyModel);
    QModelIndex sourceParent;
    if (parent.isValid())
        sourceParent = mapToSource(parent);
    else
        sourceParent = d->m_rootIndex;
    sourceModel()->fetchMore(sourceParent);
}